

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1afm.c
# Opt level: O1

FT_Error T1_Get_Track_Kerning(FT_Face face,FT_Fixed ptsize,FT_Int degree,FT_Fixed *kerning)

{
  FT_String *pFVar1;
  long lVar2;
  long lVar3;
  FT_Error FVar4;
  FT_Long FVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  
  pFVar1 = face[3].style_name;
  if (pFVar1 == (FT_String *)0x0) {
    FVar4 = 6;
  }
  else {
    if (*(int *)(pFVar1 + 0x40) != 0) {
      lVar7 = 0x20;
      uVar8 = 0;
      do {
        lVar6 = *(long *)(pFVar1 + 0x38);
        if (*(int *)(lVar6 + -0x20 + lVar7) == degree) {
          lVar2 = *(long *)(lVar6 + -0x18 + lVar7);
          if (ptsize < lVar2) {
            lVar6 = *(long *)(lVar6 + -0x10 + lVar7);
          }
          else {
            lVar3 = *(long *)(lVar6 + -8 + lVar7);
            if (lVar3 < ptsize) {
              lVar6 = *(long *)(lVar6 + lVar7);
            }
            else {
              FVar5 = FT_MulDiv(ptsize - lVar2,
                                *(long *)(lVar6 + lVar7) - *(long *)(lVar6 + -0x10 + lVar7),
                                lVar3 - lVar2);
              lVar6 = FVar5 + *(long *)(lVar6 + -0x10 + lVar7);
            }
          }
          *kerning = lVar6;
        }
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 0x28;
      } while (uVar8 < *(uint *)(pFVar1 + 0x40));
    }
    FVar4 = 0;
  }
  return FVar4;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Get_Track_Kerning( FT_Face    face,
                        FT_Fixed   ptsize,
                        FT_Int     degree,
                        FT_Fixed*  kerning )
  {
    AFM_FontInfo  fi = (AFM_FontInfo)( (T1_Face)face )->afm_data;
    FT_UInt       i;


    if ( !fi )
      return FT_THROW( Invalid_Argument );

    for ( i = 0; i < fi->NumTrackKern; i++ )
    {
      AFM_TrackKern  tk = fi->TrackKerns + i;


      if ( tk->degree != degree )
        continue;

      if ( ptsize < tk->min_ptsize )
        *kerning = tk->min_kern;
      else if ( ptsize > tk->max_ptsize )
        *kerning = tk->max_kern;
      else
      {
        *kerning = FT_MulDiv( ptsize - tk->min_ptsize,
                              tk->max_kern - tk->min_kern,
                              tk->max_ptsize - tk->min_ptsize ) +
                   tk->min_kern;
      }
    }

    return FT_Err_Ok;
  }